

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

void __thiscall json11::JsonString::~JsonString(JsonString *this)

{
  Value<(json11::Json::Type)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Value(&this->
            super_Value<(json11::Json::Type)3,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          );
  operator_delete(this);
  return;
}

Assistant:

const string &string_value() const override { return m_value; }